

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O0

int CVmObjList::getp_get_unique(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *argc)

{
  int iVar1;
  vm_obj_id_t obj;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  CVmObjList *unaff_retaddr;
  CVmObjList *new_lst_obj;
  CVmNativeCodeDesc *in_stack_ffffffffffffffb8;
  vm_val_t *this;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  vm_val_t *in_stack_ffffffffffffffc8;
  
  if ((getp_get_unique(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_get_unique(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_get_unique::desc,0);
    __cxa_guard_release(&getp_get_unique(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc)
    ;
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffffc8,
                     (uint *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
  if (iVar1 == 0) {
    CVmStack::push(in_RSI);
    this = in_RDI;
    obj = create(in_stack_ffffffffffffffc4,(char *)in_RDI);
    vm_val_t::set_obj(this,obj);
    vm_objp(0);
    CVmStack::push(in_RDI);
    cons_uniquify(unaff_retaddr);
    CVmStack::discard(2);
  }
  return 1;
}

Assistant:

int CVmObjList::getp_get_unique(VMG_ vm_val_t *retval,
                                const vm_val_t *self_val,
                                const char *lst, uint *argc)
{
    CVmObjList *new_lst_obj;
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* put myself on the stack for GC protection */
    G_stk->push(self_val);

    /* 
     *   Make a copy of our list for the return value, since the result
     *   value will never be larger than the original list.  By making a
     *   copy of the input list, we also can avoid worrying about whether
     *   the input list was a constant, and hence we don't have to worry
     *   about the possibility of constant page swapping - we'll just
     *   update elements of the copy in-place.  
     */
    retval->set_obj(create(vmg_ FALSE, lst));

    /* get the return value list data */
    new_lst_obj = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* push a reference to the new list for gc protection */
    G_stk->push(retval);

    /* uniquify the list */
    new_lst_obj->cons_uniquify(vmg0_);

    /* discard the gc protection */
    G_stk->discard(2);

    /* handled */
    return TRUE;
}